

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O0

void __thiscall
ElementsAddressFactory_CheckConfidentialAddressNetType_Test::TestBody
          (ElementsAddressFactory_CheckConfidentialAddressNetType_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  byte bVar9;
  undefined1 uVar10;
  char *pcVar11;
  char *in_R9;
  AssertionResult gtest_ar__13;
  AssertionResult gtest_ar__12;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  Script script;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  ElementsConfidentialAddress conf_addr;
  Address addr;
  Pubkey pubkey;
  ConfidentialKey confidential_key;
  ElementsAddressFactory factory;
  undefined6 in_stack_fffffffffffff088;
  undefined1 in_stack_fffffffffffff08e;
  undefined1 in_stack_fffffffffffff08f;
  undefined1 in_stack_fffffffffffff090;
  undefined1 in_stack_fffffffffffff091;
  undefined1 in_stack_fffffffffffff092;
  undefined1 in_stack_fffffffffffff093;
  undefined1 in_stack_fffffffffffff094;
  undefined1 in_stack_fffffffffffff095;
  undefined1 in_stack_fffffffffffff096;
  undefined1 in_stack_fffffffffffff097;
  undefined1 in_stack_fffffffffffff098;
  undefined1 in_stack_fffffffffffff099;
  undefined1 in_stack_fffffffffffff09a;
  undefined1 in_stack_fffffffffffff09b;
  undefined1 in_stack_fffffffffffff09c;
  undefined1 in_stack_fffffffffffff09d;
  undefined1 in_stack_fffffffffffff09e;
  undefined1 in_stack_fffffffffffff09f;
  ElementsAddressFactory *in_stack_fffffffffffff0a0;
  allocator *confidential_key_00;
  undefined6 in_stack_fffffffffffff0a8;
  undefined1 in_stack_fffffffffffff0ae;
  undefined1 in_stack_fffffffffffff0af;
  string local_f28;
  AssertHelper local_f08;
  Message local_f00;
  byte local_ef1;
  AssertionResult local_ef0;
  string local_ee0;
  AssertHelper local_ec0;
  NetType in_stack_fffffffffffff14c;
  undefined7 in_stack_fffffffffffff150;
  undefined1 in_stack_fffffffffffff157;
  AddressFactory *in_stack_fffffffffffff158;
  string local_e98;
  AssertHelper local_e78;
  Message local_e70;
  undefined1 local_e61;
  AssertionResult local_e60;
  string local_e50;
  AssertHelper local_e30;
  Message local_e28;
  byte local_e19;
  AssertionResult local_e18;
  string local_e08;
  AssertHelper local_de8;
  NetType in_stack_fffffffffffff224;
  undefined7 in_stack_fffffffffffff228;
  undefined1 in_stack_fffffffffffff22f;
  ElementsAddressFactory *in_stack_fffffffffffff230;
  string local_dc0;
  AssertHelper local_da0;
  Message local_d98;
  byte local_d89;
  AssertionResult local_d88;
  string local_d78;
  AssertHelper local_d58;
  Message local_d50;
  byte local_d41;
  AssertionResult local_d40;
  AssertHelper local_d30;
  Message local_d28;
  ElementsConfidentialAddress local_d20;
  AssertHelper local_b70;
  Message local_b68;
  Address local_b60;
  allocator local_9e1;
  string local_9e0;
  Script local_9c0 [2];
  string local_948;
  AssertHelper local_928;
  Message local_920;
  byte local_911;
  AssertionResult local_910;
  string local_900;
  AssertHelper local_8e0;
  Message local_8d8;
  byte local_8c9;
  AssertionResult local_8c8;
  string local_8b8;
  AssertHelper local_898;
  Message local_890;
  byte local_881;
  AssertionResult local_880;
  string local_870;
  AssertHelper local_850;
  Message local_848;
  undefined1 local_839;
  AssertionResult local_838;
  string local_828;
  AssertHelper local_808;
  Message local_800;
  byte local_7f1;
  AssertionResult local_7f0;
  string local_7e0;
  AssertHelper local_7c0;
  Message local_7b8;
  byte local_7a9;
  AssertionResult local_7a8;
  string local_798;
  AssertHelper local_778;
  Message local_770;
  byte local_761;
  AssertionResult local_760;
  AssertHelper local_750;
  Message local_748;
  ElementsConfidentialAddress local_740;
  AssertHelper local_590;
  Message local_588 [2];
  Address local_578;
  ElementsConfidentialAddress local_400;
  Address local_250;
  allocator local_d1;
  string local_d0;
  Pubkey local_b0;
  allocator local_91;
  string local_90;
  Pubkey local_70 [4];
  
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_fffffffffffff0a0,
             CONCAT13(in_stack_fffffffffffff09f,
                      CONCAT12(in_stack_fffffffffffff09e,
                               CONCAT11(in_stack_fffffffffffff09d,in_stack_fffffffffffff09c))),
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT17(in_stack_fffffffffffff097,
                      CONCAT16(in_stack_fffffffffffff096,
                               CONCAT15(in_stack_fffffffffffff095,
                                        CONCAT14(in_stack_fffffffffffff094,
                                                 CONCAT13(in_stack_fffffffffffff093,
                                                          CONCAT12(in_stack_fffffffffffff092,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff091,
                                                  in_stack_fffffffffffff090))))))));
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffff0a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_90,
             "02adc4593dedbc9f03b87f636491d24965b4becb7bd546eb20cc230a7bb9384c59",&local_91);
  cfd::core::Pubkey::Pubkey(local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d0,
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",&local_d1);
  cfd::core::Pubkey::Pubkey(&local_b0,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  cfd::core::Address::Address(&local_250);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_400);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2pkhAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_fffffffffffff09f,
                          CONCAT16(in_stack_fffffffffffff09e,
                                   CONCAT15(in_stack_fffffffffffff09d,
                                            CONCAT14(in_stack_fffffffffffff09c,
                                                     CONCAT13(in_stack_fffffffffffff09b,
                                                              CONCAT12(in_stack_fffffffffffff09a,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff099,
                                                  in_stack_fffffffffffff098))))))),
                 (Pubkey *)
                 CONCAT17(in_stack_fffffffffffff097,
                          CONCAT16(in_stack_fffffffffffff096,
                                   CONCAT15(in_stack_fffffffffffff095,
                                            CONCAT14(in_stack_fffffffffffff094,
                                                     CONCAT13(in_stack_fffffffffffff093,
                                                              CONCAT12(in_stack_fffffffffffff092,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff091,
                                                  in_stack_fffffffffffff090))))))));
      cfd::core::Address::operator=(&local_250,&local_578);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_fffffffffffff097,
                          CONCAT16(in_stack_fffffffffffff096,
                                   CONCAT15(in_stack_fffffffffffff095,
                                            CONCAT14(in_stack_fffffffffffff094,
                                                     CONCAT13(in_stack_fffffffffffff093,
                                                              CONCAT12(in_stack_fffffffffffff092,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff091,
                                                  in_stack_fffffffffffff090))))))));
    }
  }
  else {
    testing::Message::Message(local_588);
    testing::internal::AssertHelper::AssertHelper
              (&local_590,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x174,
               "Expected: addr = factory.CreateP2pkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_590,local_588);
    testing::internal::AssertHelper::~AssertHelper(&local_590);
    testing::Message::~Message((Message *)0x1fca84);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ElementsAddressFactory::GetConfidentialAddress
                ((Address *)
                 CONCAT17(in_stack_fffffffffffff0af,
                          CONCAT16(in_stack_fffffffffffff0ae,in_stack_fffffffffffff0a8)),
                 (ConfidentialKey *)in_stack_fffffffffffff0a0);
      cfd::core::ElementsConfidentialAddress::operator=(&local_400,&local_740);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)
                 CONCAT17(in_stack_fffffffffffff097,
                          CONCAT16(in_stack_fffffffffffff096,
                                   CONCAT15(in_stack_fffffffffffff095,
                                            CONCAT14(in_stack_fffffffffffff094,
                                                     CONCAT13(in_stack_fffffffffffff093,
                                                              CONCAT12(in_stack_fffffffffffff092,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff091,
                                                  in_stack_fffffffffffff090))))))));
    }
  }
  else {
    testing::Message::Message(&local_748);
    testing::internal::AssertHelper::AssertHelper
              (&local_750,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x175,
               "Expected: conf_addr = factory.GetConfidentialAddress(addr, confidential_key) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_750,&local_748);
    testing::internal::AssertHelper::~AssertHelper(&local_750);
    testing::Message::~Message((Message *)0x1fcc0c);
  }
  bVar1 = cfd::ElementsAddressFactory::CheckConfidentialAddressNetType
                    (in_stack_fffffffffffff230,
                     (ElementsConfidentialAddress *)
                     CONCAT17(in_stack_fffffffffffff22f,in_stack_fffffffffffff228),
                     in_stack_fffffffffffff224);
  local_761 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_fffffffffffff097,
                      CONCAT16(in_stack_fffffffffffff096,
                               CONCAT15(in_stack_fffffffffffff095,
                                        CONCAT14(in_stack_fffffffffffff094,
                                                 CONCAT13(in_stack_fffffffffffff093,
                                                          CONCAT12(in_stack_fffffffffffff092,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff091,
                                                  in_stack_fffffffffffff090))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff08f,
                              CONCAT16(in_stack_fffffffffffff08e,in_stack_fffffffffffff088)),
             (type *)0x1fcc9c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_760);
  if (!bVar1) {
    testing::Message::Message(&local_770);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_798,(internal *)&local_760,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_778,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x176,pcVar11);
    testing::internal::AssertHelper::operator=(&local_778,&local_770);
    testing::internal::AssertHelper::~AssertHelper(&local_778);
    std::__cxx11::string::~string((string *)&local_798);
    testing::Message::~Message((Message *)0x1fcd82);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1fcdfa);
  bVar1 = cfd::ElementsAddressFactory::CheckConfidentialAddressNetType
                    (in_stack_fffffffffffff230,
                     (ElementsConfidentialAddress *)
                     CONCAT17(in_stack_fffffffffffff22f,in_stack_fffffffffffff228),
                     in_stack_fffffffffffff224);
  local_7a9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_fffffffffffff097,
                      CONCAT16(in_stack_fffffffffffff096,
                               CONCAT15(in_stack_fffffffffffff095,
                                        CONCAT14(in_stack_fffffffffffff094,
                                                 CONCAT13(in_stack_fffffffffffff093,
                                                          CONCAT12(in_stack_fffffffffffff092,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff091,
                                                  in_stack_fffffffffffff090))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff08f,
                              CONCAT16(in_stack_fffffffffffff08e,in_stack_fffffffffffff088)),
             (type *)0x1fce42);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7a8);
  if (!bVar1) {
    testing::Message::Message(&local_7b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_7e0,(internal *)&local_7a8,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x177,pcVar11);
    testing::internal::AssertHelper::operator=(&local_7c0,&local_7b8);
    testing::internal::AssertHelper::~AssertHelper(&local_7c0);
    std::__cxx11::string::~string((string *)&local_7e0);
    testing::Message::~Message((Message *)0x1fcf3a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1fcfb2);
  bVar1 = cfd::ElementsAddressFactory::CheckConfidentialAddressNetType
                    (in_stack_fffffffffffff230,
                     (ElementsConfidentialAddress *)
                     CONCAT17(in_stack_fffffffffffff22f,in_stack_fffffffffffff228),
                     in_stack_fffffffffffff224);
  local_7f1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_fffffffffffff097,
                      CONCAT16(in_stack_fffffffffffff096,
                               CONCAT15(in_stack_fffffffffffff095,
                                        CONCAT14(in_stack_fffffffffffff094,
                                                 CONCAT13(in_stack_fffffffffffff093,
                                                          CONCAT12(in_stack_fffffffffffff092,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff091,
                                                  in_stack_fffffffffffff090))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff08f,
                              CONCAT16(in_stack_fffffffffffff08e,in_stack_fffffffffffff088)),
             (type *)0x1fcffa);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7f0);
  if (!bVar1) {
    testing::Message::Message(&local_800);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_828,(internal *)&local_7f0,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_808,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x178,pcVar11);
    testing::internal::AssertHelper::operator=(&local_808,&local_800);
    testing::internal::AssertHelper::~AssertHelper(&local_808);
    std::__cxx11::string::~string((string *)&local_828);
    testing::Message::~Message((Message *)0x1fd0f2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1fd16a);
  local_839 = cfd::ElementsAddressFactory::CheckConfidentialAddressNetType
                        (in_stack_fffffffffffff230,
                         (ElementsConfidentialAddress *)
                         CONCAT17(in_stack_fffffffffffff22f,in_stack_fffffffffffff228),
                         in_stack_fffffffffffff224);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_fffffffffffff097,
                      CONCAT16(in_stack_fffffffffffff096,
                               CONCAT15(in_stack_fffffffffffff095,
                                        CONCAT14(in_stack_fffffffffffff094,
                                                 CONCAT13(in_stack_fffffffffffff093,
                                                          CONCAT12(in_stack_fffffffffffff092,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff091,
                                                  in_stack_fffffffffffff090))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff08f,
                              CONCAT16(in_stack_fffffffffffff08e,in_stack_fffffffffffff088)),
             (type *)0x1fd1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_838);
  if (!bVar1) {
    testing::Message::Message(&local_848);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_870,(internal *)&local_838,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kLiquidV1)","false",
               "true",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_850,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x179,pcVar11);
    testing::internal::AssertHelper::operator=(&local_850,&local_848);
    testing::internal::AssertHelper::~AssertHelper(&local_850);
    std::__cxx11::string::~string((string *)&local_870);
    testing::Message::~Message((Message *)0x1fd2a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1fd320);
  bVar1 = cfd::ElementsAddressFactory::CheckConfidentialAddressNetType
                    (in_stack_fffffffffffff230,
                     (ElementsConfidentialAddress *)
                     CONCAT17(in_stack_fffffffffffff22f,in_stack_fffffffffffff228),
                     in_stack_fffffffffffff224);
  local_881 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_fffffffffffff097,
                      CONCAT16(in_stack_fffffffffffff096,
                               CONCAT15(in_stack_fffffffffffff095,
                                        CONCAT14(in_stack_fffffffffffff094,
                                                 CONCAT13(in_stack_fffffffffffff093,
                                                          CONCAT12(in_stack_fffffffffffff092,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff091,
                                                  in_stack_fffffffffffff090))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff08f,
                              CONCAT16(in_stack_fffffffffffff08e,in_stack_fffffffffffff088)),
             (type *)0x1fd368);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_880);
  if (!bVar1) {
    testing::Message::Message(&local_890);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_8b8,(internal *)&local_880,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_898,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x17a,pcVar11);
    testing::internal::AssertHelper::operator=(&local_898,&local_890);
    testing::internal::AssertHelper::~AssertHelper(&local_898);
    std::__cxx11::string::~string((string *)&local_8b8);
    testing::Message::~Message((Message *)0x1fd460);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1fd4d8);
  bVar1 = cfd::ElementsAddressFactory::CheckConfidentialAddressNetType
                    (in_stack_fffffffffffff230,
                     (ElementsConfidentialAddress *)
                     CONCAT17(in_stack_fffffffffffff22f,in_stack_fffffffffffff228),
                     in_stack_fffffffffffff224);
  local_8c9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_fffffffffffff097,
                      CONCAT16(in_stack_fffffffffffff096,
                               CONCAT15(in_stack_fffffffffffff095,
                                        CONCAT14(in_stack_fffffffffffff094,
                                                 CONCAT13(in_stack_fffffffffffff093,
                                                          CONCAT12(in_stack_fffffffffffff092,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff091,
                                                  in_stack_fffffffffffff090))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff08f,
                              CONCAT16(in_stack_fffffffffffff08e,in_stack_fffffffffffff088)),
             (type *)0x1fd520);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8c8);
  if (!bVar1) {
    testing::Message::Message(&local_8d8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_900,(internal *)&local_8c8,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x17b,pcVar11);
    testing::internal::AssertHelper::operator=(&local_8e0,&local_8d8);
    testing::internal::AssertHelper::~AssertHelper(&local_8e0);
    std::__cxx11::string::~string((string *)&local_900);
    testing::Message::~Message((Message *)0x1fd618);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1fd690);
  uVar2 = cfd::ElementsAddressFactory::CheckConfidentialAddressNetType
                    (in_stack_fffffffffffff230,
                     (ElementsConfidentialAddress *)
                     CONCAT17(in_stack_fffffffffffff22f,in_stack_fffffffffffff228),
                     in_stack_fffffffffffff224);
  local_911 = ~uVar2 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_fffffffffffff097,
                      CONCAT16(in_stack_fffffffffffff096,
                               CONCAT15(in_stack_fffffffffffff095,
                                        CONCAT14(in_stack_fffffffffffff094,
                                                 CONCAT13(in_stack_fffffffffffff093,
                                                          CONCAT12(in_stack_fffffffffffff092,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff091,
                                                  in_stack_fffffffffffff090))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff08f,
                              CONCAT16(in_stack_fffffffffffff08e,in_stack_fffffffffffff088)),
             (type *)0x1fd6d8);
  uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_910);
  if (!(bool)uVar3) {
    testing::Message::Message(&local_920);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_948,(internal *)&local_910,
               (AssertionResult *)
               "factory.CheckConfidentialAddressNetType(conf_addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_928,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x17c,pcVar11);
    testing::internal::AssertHelper::operator=(&local_928,&local_920);
    testing::internal::AssertHelper::~AssertHelper(&local_928);
    std::__cxx11::string::~string((string *)&local_948);
    testing::Message::~Message((Message *)0x1fd7d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1fd84b);
  cfd::core::GetElementsAddressFormatList();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            (in_stack_fffffffffffff0a0,
             CONCAT13(in_stack_fffffffffffff09f,
                      CONCAT12(in_stack_fffffffffffff09e,
                               CONCAT11(in_stack_fffffffffffff09d,in_stack_fffffffffffff09c))),
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT17(in_stack_fffffffffffff097,
                      CONCAT16(in_stack_fffffffffffff096,
                               CONCAT15(in_stack_fffffffffffff095,
                                        CONCAT14(in_stack_fffffffffffff094,
                                                 CONCAT13(in_stack_fffffffffffff093,
                                                          CONCAT12(in_stack_fffffffffffff092,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff091,
                                                  in_stack_fffffffffffff090))))))));
  cfd::ElementsAddressFactory::operator=
            ((ElementsAddressFactory *)
             CONCAT17(in_stack_fffffffffffff097,
                      CONCAT16(in_stack_fffffffffffff096,
                               CONCAT15(in_stack_fffffffffffff095,
                                        CONCAT14(in_stack_fffffffffffff094,
                                                 CONCAT13(in_stack_fffffffffffff093,
                                                          CONCAT12(in_stack_fffffffffffff092,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff091,
                                                  in_stack_fffffffffffff090))))))),
             (ElementsAddressFactory *)
             CONCAT17(in_stack_fffffffffffff08f,
                      CONCAT16(in_stack_fffffffffffff08e,in_stack_fffffffffffff088)));
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1fd89a);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             in_stack_fffffffffffff0a0);
  confidential_key_00 = &local_9e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_9e0,"76a914ef286e6af39de178d88b32e120f716b53753808c88ac",
             confidential_key_00);
  cfd::core::Script::Script(local_9c0,&local_9e0);
  std::__cxx11::string::~string((string *)&local_9e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
  uVar4 = testing::internal::AlwaysTrue();
  if ((bool)uVar4) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2shAddress
                ((AddressFactory *)
                 CONCAT17(uVar4,CONCAT16(bVar1,CONCAT15(in_stack_fffffffffffff09d,
                                                        CONCAT14(in_stack_fffffffffffff09c,
                                                                 CONCAT13(in_stack_fffffffffffff09b,
                                                                          CONCAT12(
                                                  in_stack_fffffffffffff09a,
                                                  CONCAT11(in_stack_fffffffffffff099,
                                                           in_stack_fffffffffffff098))))))),
                 (Script *)
                 CONCAT17(in_stack_fffffffffffff097,
                          CONCAT16(in_stack_fffffffffffff096,
                                   CONCAT15(in_stack_fffffffffffff095,
                                            CONCAT14(in_stack_fffffffffffff094,
                                                     CONCAT13(in_stack_fffffffffffff093,
                                                              CONCAT12(in_stack_fffffffffffff092,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff091,
                                                  in_stack_fffffffffffff090))))))));
      cfd::core::Address::operator=(&local_250,&local_b60);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_fffffffffffff097,
                          CONCAT16(in_stack_fffffffffffff096,
                                   CONCAT15(in_stack_fffffffffffff095,
                                            CONCAT14(in_stack_fffffffffffff094,
                                                     CONCAT13(in_stack_fffffffffffff093,
                                                              CONCAT12(in_stack_fffffffffffff092,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff091,
                                                  in_stack_fffffffffffff090))))))));
    }
  }
  else {
    testing::Message::Message(&local_b68);
    testing::internal::AssertHelper::AssertHelper
              (&local_b70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x180,
               "Expected: addr = factory.CreateP2shAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_b70,&local_b68);
    testing::internal::AssertHelper::~AssertHelper(&local_b70);
    testing::Message::~Message((Message *)0x1fdb02);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ElementsAddressFactory::GetConfidentialAddress
                ((Address *)CONCAT17(uVar2,CONCAT16(uVar3,in_stack_fffffffffffff0a8)),
                 (ConfidentialKey *)confidential_key_00);
      cfd::core::ElementsConfidentialAddress::operator=(&local_400,&local_d20);
      cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
                ((ElementsConfidentialAddress *)
                 CONCAT17(in_stack_fffffffffffff097,
                          CONCAT16(in_stack_fffffffffffff096,
                                   CONCAT15(in_stack_fffffffffffff095,
                                            CONCAT14(in_stack_fffffffffffff094,
                                                     CONCAT13(in_stack_fffffffffffff093,
                                                              CONCAT12(in_stack_fffffffffffff092,
                                                                       CONCAT11(
                                                  in_stack_fffffffffffff091,
                                                  in_stack_fffffffffffff090))))))));
    }
  }
  else {
    testing::Message::Message(&local_d28);
    testing::internal::AssertHelper::AssertHelper
              (&local_d30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x181,
               "Expected: conf_addr = factory.GetConfidentialAddress(addr, confidential_key) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_d30,&local_d28);
    testing::internal::AssertHelper::~AssertHelper(&local_d30);
    testing::Message::~Message((Message *)0x1fdc8a);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_fffffffffffff158,
                     (Address *)CONCAT17(in_stack_fffffffffffff157,in_stack_fffffffffffff150),
                     in_stack_fffffffffffff14c);
  local_d41 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_fffffffffffff097,
                      CONCAT16(in_stack_fffffffffffff096,
                               CONCAT15(in_stack_fffffffffffff095,
                                        CONCAT14(in_stack_fffffffffffff094,
                                                 CONCAT13(in_stack_fffffffffffff093,
                                                          CONCAT12(in_stack_fffffffffffff092,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff091,
                                                  in_stack_fffffffffffff090))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff08f,
                              CONCAT16(in_stack_fffffffffffff08e,in_stack_fffffffffffff088)),
             (type *)0x1fdd1a);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d40);
  if (!bVar1) {
    testing::Message::Message(&local_d50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d78,(internal *)&local_d40,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x182,pcVar11);
    testing::internal::AssertHelper::operator=(&local_d58,&local_d50);
    testing::internal::AssertHelper::~AssertHelper(&local_d58);
    std::__cxx11::string::~string((string *)&local_d78);
    testing::Message::~Message((Message *)0x1fde00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1fde78);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_fffffffffffff158,
                     (Address *)CONCAT17(in_stack_fffffffffffff157,in_stack_fffffffffffff150),
                     in_stack_fffffffffffff14c);
  local_d89 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_fffffffffffff097,
                      CONCAT16(in_stack_fffffffffffff096,
                               CONCAT15(in_stack_fffffffffffff095,
                                        CONCAT14(in_stack_fffffffffffff094,
                                                 CONCAT13(in_stack_fffffffffffff093,
                                                          CONCAT12(in_stack_fffffffffffff092,
                                                                   CONCAT11(
                                                  in_stack_fffffffffffff091,
                                                  in_stack_fffffffffffff090))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff08f,
                              CONCAT16(in_stack_fffffffffffff08e,in_stack_fffffffffffff088)),
             (type *)0x1fdec0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d88);
  if (!bVar1) {
    testing::Message::Message(&local_d98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_dc0,(internal *)&local_d88,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_da0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x183,pcVar11);
    testing::internal::AssertHelper::operator=(&local_da0,&local_d98);
    testing::internal::AssertHelper::~AssertHelper(&local_da0);
    std::__cxx11::string::~string((string *)&local_dc0);
    testing::Message::~Message((Message *)0x1fdfb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1fe030);
  uVar2 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_fffffffffffff158,
                     (Address *)CONCAT17(in_stack_fffffffffffff157,in_stack_fffffffffffff150),
                     in_stack_fffffffffffff14c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffff096,
                                     CONCAT15(in_stack_fffffffffffff095,
                                              CONCAT14(in_stack_fffffffffffff094,
                                                       CONCAT13(in_stack_fffffffffffff093,
                                                                CONCAT12(in_stack_fffffffffffff092,
                                                                         CONCAT11(
                                                  in_stack_fffffffffffff091,
                                                  in_stack_fffffffffffff090))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff08f,
                              CONCAT16(in_stack_fffffffffffff08e,in_stack_fffffffffffff088)),
             (type *)0x1fe078);
  uVar3 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffff230);
  if (!(bool)uVar3) {
    testing::Message::Message((Message *)&stack0xfffffffffffff220);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e08,(internal *)&stack0xfffffffffffff230,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_de8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x184,pcVar11);
    testing::internal::AssertHelper::operator=(&local_de8,(Message *)&stack0xfffffffffffff220);
    testing::internal::AssertHelper::~AssertHelper(&local_de8);
    std::__cxx11::string::~string((string *)&local_e08);
    testing::Message::~Message((Message *)0x1fe170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1fe1e8);
  uVar4 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_fffffffffffff158,
                     (Address *)CONCAT17(in_stack_fffffffffffff157,in_stack_fffffffffffff150),
                     in_stack_fffffffffffff14c);
  local_e19 = ~uVar4 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(in_stack_fffffffffffff094,
                                                                   CONCAT13(
                                                  in_stack_fffffffffffff093,
                                                  CONCAT12(in_stack_fffffffffffff092,
                                                           CONCAT11(in_stack_fffffffffffff091,
                                                                    in_stack_fffffffffffff090)))))))
             ,(bool *)CONCAT17(in_stack_fffffffffffff08f,
                               CONCAT16(in_stack_fffffffffffff08e,in_stack_fffffffffffff088)),
             (type *)0x1fe230);
  uVar5 = testing::AssertionResult::operator_cast_to_bool(&local_e18);
  if (!(bool)uVar5) {
    testing::Message::Message(&local_e28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e50,(internal *)&local_e18,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x185,pcVar11);
    testing::internal::AssertHelper::operator=(&local_e30,&local_e28);
    testing::internal::AssertHelper::~AssertHelper(&local_e30);
    std::__cxx11::string::~string((string *)&local_e50);
    testing::Message::~Message((Message *)0x1fe328);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1fe3a0);
  uVar6 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_fffffffffffff158,
                     (Address *)CONCAT17(in_stack_fffffffffffff157,in_stack_fffffffffffff150),
                     in_stack_fffffffffffff14c);
  local_e61 = uVar6;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  in_stack_fffffffffffff092,
                                                  CONCAT11(in_stack_fffffffffffff091,
                                                           in_stack_fffffffffffff090))))))),
             (bool *)CONCAT17(in_stack_fffffffffffff08f,
                              CONCAT16(in_stack_fffffffffffff08e,in_stack_fffffffffffff088)),
             (type *)0x1fe3e6);
  uVar7 = testing::AssertionResult::operator_cast_to_bool(&local_e60);
  if (!(bool)uVar7) {
    testing::Message::Message(&local_e70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e98,(internal *)&local_e60,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "false","true",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x186,pcVar11);
    testing::internal::AssertHelper::operator=(&local_e78,&local_e70);
    testing::internal::AssertHelper::~AssertHelper(&local_e78);
    std::__cxx11::string::~string((string *)&local_e98);
    testing::Message::~Message((Message *)0x1fe4de);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1fe556);
  uVar8 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_fffffffffffff158,
                     (Address *)CONCAT17(in_stack_fffffffffffff157,in_stack_fffffffffffff150),
                     in_stack_fffffffffffff14c);
  bVar9 = ~uVar8 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,in_stack_fffffffffffff090))))
                                                  ))),
             (bool *)CONCAT17(in_stack_fffffffffffff08f,
                              CONCAT16(in_stack_fffffffffffff08e,in_stack_fffffffffffff088)),
             (type *)0x1fe59e);
  uVar10 = testing::AssertionResult::operator_cast_to_bool
                     ((AssertionResult *)&stack0xfffffffffffff158);
  if (!(bool)uVar10) {
    testing::Message::Message((Message *)&stack0xfffffffffffff148);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_ee0,(internal *)&stack0xfffffffffffff158,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ec0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x187,pcVar11);
    testing::internal::AssertHelper::operator=(&local_ec0,(Message *)&stack0xfffffffffffff148);
    testing::internal::AssertHelper::~AssertHelper(&local_ec0);
    std::__cxx11::string::~string((string *)&local_ee0);
    testing::Message::~Message((Message *)0x1fe696);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1fe70e);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    (in_stack_fffffffffffff158,(Address *)CONCAT17(bVar9,in_stack_fffffffffffff150),
                     in_stack_fffffffffffff14c);
  local_ef1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar10))))))),
             (bool *)CONCAT17(bVar1,CONCAT16(in_stack_fffffffffffff08e,in_stack_fffffffffffff088)),
             (type *)0x1fe756);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ef0);
  if (!bVar1) {
    testing::Message::Message(&local_f00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f28,(internal *)&local_ef0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar11 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x188,pcVar11);
    testing::internal::AssertHelper::operator=(&local_f08,&local_f00);
    testing::internal::AssertHelper::~AssertHelper(&local_f08);
    std::__cxx11::string::~string((string *)&local_f28);
    testing::Message::~Message((Message *)0x1fe833);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1fe8a2);
  cfd::core::Script::~Script
            ((Script *)
             CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar10))))))));
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)
             CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar10))))))));
  cfd::core::Address::~Address
            ((Address *)
             CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar10))))))));
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x1fe8d6);
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x1fe8e3);
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1fe8f0);
  return;
}

Assistant:

TEST(ElementsAddressFactory, CheckConfidentialAddressNetType)
{
  ElementsAddressFactory factory(NetType::kLiquidV1, GetElementsAddressFormatList());
  ConfidentialKey confidential_key = ConfidentialKey("02adc4593dedbc9f03b87f636491d24965b4becb7bd546eb20cc230a7bb9384c59");
  Pubkey pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  Address addr;
  ElementsConfidentialAddress conf_addr;
  EXPECT_NO_THROW(addr = factory.CreateP2pkhAddress(pubkey));
  EXPECT_NO_THROW(conf_addr = factory.GetConfidentialAddress(addr, confidential_key));
  EXPECT_FALSE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckConfidentialAddressNetType(conf_addr, NetType::kNetTypeNum));

  factory = ElementsAddressFactory(NetType::kElementsRegtest, GetElementsAddressFormatList());
  Script script = Script("76a914ef286e6af39de178d88b32e120f716b53753808c88ac");
  EXPECT_NO_THROW(addr = factory.CreateP2shAddress(script));
  EXPECT_NO_THROW(conf_addr = factory.GetConfidentialAddress(addr, confidential_key));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));
}